

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  const_iterator cVar1;
  iterator *piVar2;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __position;
  undefined4 in_register_0000000c;
  char (*Args_1) [60];
  uint uVar3;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __position_00;
  allocator local_209;
  TokenListType *local_208;
  uint local_1fc;
  iterator *local_1f8;
  ConversionStream *local_1f0;
  char (*local_1e8) [60];
  string err;
  String local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Args_1 = (char (*) [60])CONCAT44(in_register_0000000c,ArrayDim);
  __position_00._M_node = Token->_M_node;
  __position._M_node = ScopeEnd->_M_node;
  local_1fc = ArrayDim + 1;
  local_208 = &this->m_Tokens;
  local_1f8 = Token;
  local_1f0 = this;
  local_1e8 = Args_1;
  for (uVar3 = 0; piVar2 = local_1f8, local_1fc != uVar3; uVar3 = uVar3 + 1) {
    __position_00._M_node = (__position_00._M_node)->_M_next;
    if ((__position_00._M_node == ScopeEnd->_M_node) ||
       (*(int *)&__position_00._M_node[1]._M_next != 0x137)) goto LAB_00331c14;
    err._M_dataplus._M_p =
         (pointer)(local_208->
                  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
    __position = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&err,ScopeEnd,
                            __position_00);
    if (local_1f8->_M_node == ScopeEnd->_M_node) {
      FormatString<char[47]>(&err,(char (*) [47])"Unable to find matching closing square bracket");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_190,local_1f0,local_1f8,4);
      Args_1 = (char (*) [60])0x83f;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessRWTextureLoad",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x83f,&err,(char (*) [2])0x70fe85,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&err);
    }
    if (*(int *)&__position._M_node[1]._M_next != 0x138) {
      FormatString<char[26],char[60]>
                (&err,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",Args_1
                );
      Args_1 = (char (*) [60])0x844;
      DebugAssertionFailed
                (err._M_dataplus._M_p,"ProcessRWTextureLoad",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x844);
      std::__cxx11::string::~string((string *)&err);
    }
    if (uVar3 < (uint)local_1e8) {
      __position_00 = __position;
    }
  }
  cVar1._M_node = local_1f8->_M_node;
  std::__cxx11::string::string((string *)&local_50,"imageLoad",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_70,(char *)piVar2->_M_node[3]._M_prev,&local_209);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err,Identifier,&local_50,&local_70,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(local_208,cVar1,(HLSLTokenInfo *)&err);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  cVar1._M_node = piVar2->_M_node;
  std::__cxx11::string::string((string *)&local_90,"(",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_b0,"",&local_209);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err,OpenParen,&local_90,&local_b0,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(local_208,cVar1,(HLSLTokenInfo *)&err);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::assign((char *)&piVar2->_M_node[3]._M_prev);
  std::__cxx11::string::string((string *)&local_d0,",",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_f0,"",&local_209);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err,Comma,&local_d0,&local_f0,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (local_208,(const_iterator)__position_00._M_node,(HLSLTokenInfo *)&err);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"_ToIvec",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_130," ",&local_209);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err,Identifier,&local_110,&local_130,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (local_208,(const_iterator)__position_00._M_node,(HLSLTokenInfo *)&err);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  *(undefined4 *)&__position_00._M_node[1]._M_next = 0x135;
  std::__cxx11::string::assign((char *)&__position_00._M_node[1]._M_prev);
  std::__cxx11::string::string((string *)&local_150,")",(allocator *)&local_190);
  std::__cxx11::string::string((string *)&local_170,"",&local_209);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err,ClosingParen,&local_150,&local_170,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (local_208,(const_iterator)__position._M_node,(HLSLTokenInfo *)&err);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  *(undefined4 *)&__position._M_node[1]._M_next = 0x136;
  std::__cxx11::string::assign((char *)&__position._M_node[1]._M_prev);
  piVar2->_M_node = __position_00._M_node;
LAB_00331c14:
  return local_1fc <= uVar3;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad(TokenListType::iterator&       Token,
                                                                    const TokenListType::iterator& ScopeEnd,
                                                                    Uint32                         ArrayDim)
{
    // RWTex[Location.xy]
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy]
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageLoad", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageLoad( RWTex[Location.xy]
    //            ^    ^
    //        Token   OpenStaplePos

    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Comma, ",", ""));
    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    // imageLoad( RWTex, _ToIvec[Location.xy]
    //                          ^
    //                       OpenStapleToken

    OpenStapleToken->Type    = TokenType::OpenParen;
    OpenStapleToken->Literal = "(";
    // imageLoad( RWTex, _ToIvec(Location.xy]
    //                          ^           ^
    //                 OpenStapleToken    ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageLoad( RWTex, _ToIvec(Location.xy)]
    //                                       ^
    //                                   ClosingStapleToken


    ClosingStapleToken->Type    = TokenType::ClosingParen;
    ClosingStapleToken->Literal = ")";
    // imageLoad( RWTex, _ToIvec(Location.xy))
    //                          ^
    //                      OpenStapleToken

    Token = OpenStapleToken;

    // Note that 'Location' may require further conversion

    return true;
}